

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::dump_edges(DG2Dot<dg::LLVMNode> *this)

{
  DependenceGraph<dg::LLVMNode> *pDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Rb_tree_node_base *p_Var4;
  pair<std::_Rb_tree_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar5;
  element_type *local_28;
  
  pDVar1 = this->dg;
  for (p_Var4 = (pDVar1->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pDVar1->nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    dump_node_edges(this,(LLVMNode *)p_Var4[1]._M_parent,1);
  }
  local_28 = (this->dg->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Var2 = (this->dg->global_nodes).
           super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
    }
  }
  pVar5 = std::
          _Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
          ::
          _M_insert_unique<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>
                    ((_Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
                      *)&this->dumpedGlobals,&local_28);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    peVar3 = (this->dg->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var2 = (this->dg->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    for (p_Var4 = (peVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(peVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      dump_node_edges(this,(LLVMNode *)p_Var4[1]._M_parent,1);
    }
  }
  return;
}

Assistant:

void dump_edges() {
        for (auto &I : *dg) {
            dump_node_edges(I.second);
        }

        if (dumpedGlobals.insert(dg->getGlobalNodes().get()).second)
            for (auto &I : *dg->getGlobalNodes())
                dump_node_edges(I.second);
    }